

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkYddNorm(ARKodeMem ark_mem,realtype hg,realtype *yddnrm)

{
  int iVar1;
  realtype rVar2;
  
  if (ark_mem->interp == (ARKInterp)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode","arkYddNorm","Missing interpolation structure");
  }
  else {
    N_VLinearSum(hg,ark_mem->fn,1.0,ark_mem->yn,ark_mem->ycur);
    iVar1 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tcur + hg,ark_mem->ycur,ark_mem->tempv1,2);
    if (iVar1 == 0) {
      N_VLinearSum(1.0 / hg,ark_mem->tempv1,-1.0 / hg,ark_mem->fn,ark_mem->tempv1);
      N_VScale(1.0,ark_mem->yn,ark_mem->ycur);
      rVar2 = N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
      *yddnrm = rVar2;
      iVar1 = 0;
    }
    else {
      iVar1 = -8;
    }
  }
  return iVar1;
}

Assistant:

int arkYddNorm(ARKodeMem ark_mem, realtype hg, realtype *yddnrm)
{
  int retval;

  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode", "arkYddNorm",
                    "Missing interpolation structure");
    return(ARK_MEM_NULL);
  }

  /* increment y with a multiple of f */
  N_VLinearSum(hg, ark_mem->fn, ONE, ark_mem->yn, ark_mem->ycur);

  /* compute y', via the ODE RHS routine */
  retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur + hg, ark_mem->ycur,
                                 ark_mem->tempv1, ARK_FULLRHS_OTHER);
  if (retval != 0) return(ARK_RHSFUNC_FAIL);

  /* difference new f and original f to estimate y'' */
  N_VLinearSum(ONE/hg, ark_mem->tempv1, -ONE/hg, ark_mem->fn, ark_mem->tempv1);

  /* reset ycur to equal yn (unnecessary?) */
  N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

  /* compute norm of y'' */
  *yddnrm = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);

  return(ARK_SUCCESS);
}